

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_util.cpp
# Opt level: O2

void __thiscall
duckdb::HTTPUtil::ParseHTTPProxyHost
          (HTTPUtil *this,string *proxy_value,string *hostname_out,idx_t *port_out,
          idx_t default_port)

{
  bool bVar1;
  long lVar2;
  reference value;
  InvalidInputException *pIVar3;
  undefined1 strict;
  string_t input;
  allocator local_121;
  idx_t port;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  proxy_split;
  anon_union_16_2_67f50693_for_value local_e0;
  string sanitized_proxy_value;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  strict = (undefined1)default_port;
  ::std::__cxx11::string::string((string *)&sanitized_proxy_value,(string *)this);
  ::std::__cxx11::string::string((string *)&local_90,(string *)this);
  ::std::__cxx11::string::string((string *)&local_b0,"http://",(allocator *)&local_118);
  bVar1 = StringUtil::StartsWith(&local_90,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)&local_118,(ulong)this);
    ::std::__cxx11::string::operator=((string *)&sanitized_proxy_value,(string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_118);
  }
  ::std::__cxx11::string::string((string *)&local_118,":",(allocator *)&port);
  StringUtil::Split(&proxy_split,&sanitized_proxy_value,&local_118);
  ::std::__cxx11::string::~string((string *)&local_118);
  lVar2 = (long)proxy_split.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)proxy_split.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar2 == 2) {
    value = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::get<true>(&proxy_split,1);
    string_t::string_t((string_t *)&local_e0.pointer,value);
    input.value.pointer.ptr = (char *)&port;
    input.value._0_8_ = local_e0.pointer.ptr;
    bVar1 = TryCast::Operation<duckdb::string_t,unsigned_long>
                      ((TryCast *)local_e0._0_8_,input,(uint64_t *)0x0,(bool)strict);
    if (!bVar1) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_118,"Failed to parse port from http_proxy \'%s\'",&local_121);
      ::std::__cxx11::string::string((string *)&local_50,(string *)this);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar3,&local_118,&local_50);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    get<true>(&proxy_split,0);
    ::std::__cxx11::string::_M_assign((string *)proxy_value);
    (hostname_out->_M_dataplus)._M_p = (pointer)port;
  }
  else {
    if (lVar2 != 1) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_118,"Failed to parse http_proxy \'%s\' into a host and port",
                 (allocator *)&port);
      ::std::__cxx11::string::string((string *)&local_70,(string *)this);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar3,&local_118,&local_70);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    get<true>(&proxy_split,0);
    ::std::__cxx11::string::_M_assign((string *)proxy_value);
    (hostname_out->_M_dataplus)._M_p = (pointer)port_out;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&proxy_split);
  ::std::__cxx11::string::~string((string *)&sanitized_proxy_value);
  return;
}

Assistant:

void HTTPUtil::ParseHTTPProxyHost(string &proxy_value, string &hostname_out, idx_t &port_out, idx_t default_port) {
	auto sanitized_proxy_value = proxy_value;
	if (StringUtil::StartsWith(proxy_value, "http://")) {
		sanitized_proxy_value = proxy_value.substr(7);
	}
	auto proxy_split = StringUtil::Split(sanitized_proxy_value, ":");
	if (proxy_split.size() == 1) {
		hostname_out = proxy_split[0];
		port_out = default_port;
	} else if (proxy_split.size() == 2) {
		idx_t port;
		if (!TryCast::Operation<string_t, idx_t>(proxy_split[1], port, false)) {
			throw InvalidInputException("Failed to parse port from http_proxy '%s'", proxy_value);
		}
		hostname_out = proxy_split[0];
		port_out = port;
	} else {
		throw InvalidInputException("Failed to parse http_proxy '%s' into a host and port", proxy_value);
	}
}